

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O1

BOOL __thiscall
Js::JavascriptProxy::GetDiagTypeString
          (JavascriptProxy *this,StringBuilder<Memory::ArenaAllocator> *stringBuilder,
          ScriptContext *requestContext)

{
  RecyclableObject *pRVar1;
  bool bVar2;
  int iVar3;
  JavascriptProxy *this_00;
  
  this_00 = UnwrapNestedProxies(this);
  bVar2 = IsRevoked(this_00);
  if (!bVar2) {
    pRVar1 = (this_00->target).ptr;
    iVar3 = (*(pRVar1->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x51])(pRVar1,stringBuilder,requestContext);
    return iVar3;
  }
  bVar2 = ThreadContext::RecordImplicitException
                    (((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                        javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
                     threadContext);
  if (!bVar2) {
    return 0;
  }
  JavascriptError::ThrowTypeError
            ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
              ptr)->super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ea15,L"getTypeString");
}

Assistant:

BOOL JavascriptProxy::GetDiagTypeString(StringBuilder<ArenaAllocator>* stringBuilder, ScriptContext* requestContext)
    {
        const JavascriptProxy* proxy = UnwrapNestedProxies(this);

        //RecyclableObject* targetObj;
        if (proxy->IsRevoked())
        {
            ThreadContext* threadContext = GetScriptContext()->GetThreadContext();
            // the proxy has been revoked; TypeError.
            if (!threadContext->RecordImplicitException())
                return FALSE;
            JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_ErrorOnRevokedProxy, _u("getTypeString"));
        }
        return proxy->target->GetDiagTypeString(stringBuilder, requestContext);
    }